

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch.c
# Opt level: O0

int pnga_sprs_array_num_nonzeros(Integer g_a)

{
  int iVar1;
  long lVar2;
  long in_RDI;
  double *dptr_1;
  float *fptr_1;
  double *dptr;
  float *fptr;
  longlong *llptr;
  long *lptr;
  int *iptr;
  Integer i;
  Integer nelem;
  Integer nprocs;
  Integer me;
  Integer type;
  Integer handle;
  Integer ld;
  Integer hi [2];
  Integer lo [2];
  void *ptr;
  Integer cnt;
  Integer in_stack_000000e8;
  char *in_stack_000000f0;
  Integer *in_stack_00000258;
  Integer *in_stack_00000260;
  Integer in_stack_00000268;
  Integer in_stack_00000270;
  Integer *in_stack_00000330;
  void *in_stack_00000338;
  Integer *in_stack_00000340;
  Integer *in_stack_00000348;
  Integer in_stack_00000350;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  long local_80;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  char *local_20;
  int local_4;
  
  lVar2 = in_RDI + 1000;
  iVar1 = GA[lVar2].type;
  pnga_pgroup_nodeid((long)GA[lVar2].p_handle);
  pnga_pgroup_nnodes((long)GA[lVar2].p_handle);
  if (GA[lVar2].ndim != 2) {
    pnga_error(in_stack_000000f0,in_stack_000000e8);
  }
  pnga_distribution(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
  lVar2 = ((local_48 - local_38) + 1) * ((local_40 - local_30) + 1);
  pnga_access_ptr(in_stack_00000350,in_stack_00000348,in_stack_00000340,in_stack_00000338,
                  in_stack_00000330);
  if (iVar1 == 0x3e9) {
    for (local_80 = 0; local_80 < lVar2; local_80 = local_80 + 1) {
    }
  }
  else if (iVar1 == 0x3ea) {
    for (local_80 = 0; in_stack_ffffffffffffff70 = local_20, local_80 < lVar2;
        local_80 = local_80 + 1) {
    }
  }
  else if (iVar1 == 0x3f8) {
    for (local_80 = 0; in_stack_ffffffffffffff68 = local_20, local_80 < lVar2;
        local_80 = local_80 + 1) {
    }
  }
  else if (iVar1 == 0x3eb) {
    for (local_80 = 0; in_stack_ffffffffffffff60 = local_20, local_80 < lVar2;
        local_80 = local_80 + 1) {
    }
  }
  else if (iVar1 == 0x3ec) {
    for (local_80 = 0; in_stack_ffffffffffffff58 = local_20, local_80 < lVar2;
        local_80 = local_80 + 1) {
    }
  }
  else if (iVar1 == 0x3ee) {
    for (local_80 = 0; in_stack_ffffffffffffff50 = local_20, local_80 < lVar2;
        local_80 = local_80 + 1) {
    }
  }
  else if (iVar1 == 0x3ef) {
    for (local_80 = 0; local_80 < lVar2; local_80 = local_80 + 1) {
    }
  }
  pnga_pgroup_gop((Integer)in_stack_ffffffffffffff70,(Integer)in_stack_ffffffffffffff68,
                  in_stack_ffffffffffffff60,(Integer)in_stack_ffffffffffffff58,
                  in_stack_ffffffffffffff50);
  return local_4;
}

Assistant:

int pnga_sprs_array_num_nonzeros(Integer g_a)
{
  Integer cnt = 0;
  void *ptr;
  Integer lo[2], hi[2], ld;
  Integer handle = g_a + GA_OFFSET;
  Integer type = GA[handle].type;
  Integer me = pnga_pgroup_nodeid(GA[handle].p_handle);
  Integer nprocs = pnga_pgroup_nnodes(GA[handle].p_handle);
  Integer nelem;
  Integer i;

  if (GA[handle].ndim != 2)
    pnga_error("Array must be 2 dimensional",GA[handle].ndim);
  pnga_distribution(g_a,me,lo,hi);
  nelem = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
  pnga_access_ptr(g_a,lo,hi,&ptr,&ld);
  if (type == C_INT) {
    int *iptr = (int*)ptr;
    for (i=0; i<nelem; i++) {
      if (iptr[i] != 0) cnt++;
    }
  } else if (type == C_LONG) {
    long *lptr = (long*)ptr;
    for (i=0; i<nelem; i++) {
      if (lptr[i] != 0) cnt++;
    }
  } else if (type == C_LONGLONG) {
    long long *llptr = (long long*)ptr;
    for (i=0; i<nelem; i++) {
      if (llptr[i] != 0) cnt++;
    }
  } else if (type == C_FLOAT) {
    float *fptr = (float*)ptr;
    for (i=0; i<nelem; i++) {
      if (fptr[i] != 0.0) cnt++;
    }
  } else if (type == C_DBL) {
    double *dptr = (double*)ptr;
    for (i=0; i<nelem; i++) {
      if (dptr[i] != 0.0) cnt++;
    }
  } else if (type == C_SCPL) {
    float *fptr = (float*)ptr;
    for (i=0; i<nelem; i++) {
      if (fptr[2*i] != 0.0 || fptr[2*i+1] != 0.0) cnt++;
    }
  } else if (type == C_DCPL) {
    double *dptr = (double*)ptr;
    for (i=0; i<nelem; i++) {
      if (dptr[2*i] != 0.0 || dptr[2*i+1] != 0.0) cnt++;
    }
  }
  pnga_pgroup_gop(GA[handle].p_handle,type,&cnt,nprocs,"+");
}